

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

void sq_weakref(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr local_18;
  
  pSVar2 = stack_get(v,idx);
  local_18.super_SQObject._type = (pSVar2->super_SQObject)._type;
  if ((local_18.super_SQObject._type >> 0x1b & 1) == 0) {
    local_18.super_SQObject._unVal = (pSVar2->super_SQObject)._unVal;
    SQVM::Push(v,&local_18);
  }
  else {
    local_18.super_SQObject._unVal.pWeakRef =
         SQRefCounted::GetWeakRef
                   ((pSVar2->super_SQObject)._unVal.pRefCounted,local_18.super_SQObject._type);
    local_18.super_SQObject._type = OT_WEAKREF;
    pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQVM::Push(v,&local_18);
  }
  SQObjectPtr::~SQObjectPtr(&local_18);
  return;
}

Assistant:

void sq_weakref(HSQUIRRELVM v,SQInteger idx)
{
    SQObject &o=stack_get(v,idx);
    if(ISREFCOUNTED(sq_type(o))) {
        v->Push(_refcounted(o)->GetWeakRef(sq_type(o)));
        return;
    }
    v->Push(o);
}